

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          ReferenceVars *type_vars,Index binding_index_offset)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  char *pcVar6;
  int __c;
  string *name_00;
  string name;
  ReferenceVar local_138;
  Location loc;
  Var type;
  Var local_78;
  
  while( true ) {
    name_00 = &name;
    bVar3 = MatchLpar(this,token);
    if (!bVar3) {
      return (Result)Ok;
    }
    TVar4 = Peek(this,0);
    if (TVar4 == Last_String) {
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      Var::Var(&type);
      GetLocation(&loc,this);
      ParseBindVarOpt(this,name_00);
      RVar5 = ParseValueType(this,&type);
      if (RVar5.enum_ == Error) {
        Var::~Var(&type);
        std::__cxx11::string::_M_dispose();
        return (Result)Error;
      }
      local_138.var.loc.field_1.field_0.last_column =
           (int)((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3) + binding_index_offset
      ;
      local_138.var.loc.filename._M_str._0_4_ = loc.field_1.field_0.line;
      local_138.var.loc.filename._M_str._4_4_ = loc.field_1.field_0.first_column;
      local_138.var.loc.field_1.field_0.line = loc.field_1.field_0.last_column;
      local_138.var.loc.field_1.field_0.first_column = loc.field_1._12_4_;
      local_138._4_4_ = loc.filename._M_len._4_4_;
      local_138.index = (uint32_t)loc.filename._M_len;
      local_138.var.loc.filename._M_len._0_4_ = loc.filename._M_str._0_4_;
      local_138.var.loc.filename._M_len._4_4_ = loc.filename._M_str._4_4_;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)bindings,name_00,&local_138);
      if (type.type_ == Name) {
        if (this->options_[6] == (WastParseOptions)0x0) {
          __assert_fail("options_->features.function_references_enabled()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0x80f,
                        "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, ReferenceVars *, Index)"
                       );
        }
        pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Var::Var(&local_78,&type);
        local_138.index = (uint32_t)((ulong)((long)pTVar1 - (long)pTVar2) >> 3);
        Var::Var(&local_138.var,&local_78);
        std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
        ::emplace_back<wabt::WastParser::ReferenceVar>(type_vars,&local_138);
        Var::~Var(&local_138.var);
        Var::~Var(&local_78);
        local_138.index = 0xffffffeb;
        local_138._4_4_ = 0xffffffff;
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                  (types,(Type *)&local_138);
      }
      else {
        if (type.type_ != Index) {
          __assert_fail("type.is_name()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0x80e,
                        "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, ReferenceVars *, Index)"
                       );
        }
        pcVar6 = Var::index(&type,(char *)name_00,__c);
        Type::Type((Type *)&local_138,(int32_t)pcVar6);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                  (types,(Type *)&local_138);
      }
      Var::~Var(&type);
      std::__cxx11::string::_M_dispose();
    }
    else {
      RVar5 = ParseValueTypeList(this,types,type_vars);
    }
    if (RVar5.enum_ == Error) break;
    RVar5 = Expect(this,Rpar);
    if (RVar5.enum_ == Error) {
      return (Result)Error;
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBoundValueTypeList(TokenType token,
                                           TypeVector* types,
                                           BindingHash* bindings,
                                           ReferenceVars* type_vars,
                                           Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Var type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      if (type.is_index()) {
        types->push_back(Type(type.index()));
      } else {
        assert(type.is_name());
        assert(options_->features.function_references_enabled());
        type_vars->push_back(ReferenceVar(types->size(), type));
        types->push_back(Type(Type::Reference, kInvalidIndex));
      }
    } else {
      CHECK_RESULT(ParseValueTypeList(types, type_vars));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}